

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O1

size_t __thiscall lan::db::str_get_str_end(db *this,string *content,size_t spoint)

{
  pointer pcVar1;
  ulong uVar2;
  bool bVar3;
  
  do {
    uVar2 = std::__cxx11::string::find((char)content,0x22);
    pcVar1 = (content->_M_dataplus)._M_p;
    if (((pcVar1[uVar2] == '\"') && (pcVar1[uVar2 - 1] == '\\')) && (pcVar1[uVar2 - 2] == '\\')) {
      bVar3 = pcVar1[uVar2 - 3] == '\\';
    }
    else {
      bVar3 = false;
    }
  } while ((bVar3) ||
          (((uVar2 != 0 && (pcVar1[uVar2] == '\"')) &&
           ((uVar2 < content->_M_string_length &&
            ((pcVar1[uVar2 - 1] == '\\' && (pcVar1[uVar2 - 2] != '\\'))))))));
  return uVar2;
}

Assistant:

size_t db::str_get_str_end(std::string content, size_t spoint){
            size_t index;
            bool jmp (false);
            do {
                jmp = false;
                index = content.find('\"', spoint);
                if(content[index] == '"' and content[index-1] == '\\' and content[index-2] == '\\' and content[index-3] == '\\') jmp = true;
                spoint = index+1;
            } while(jmp or (index > 0 and index < content.length() and (content[index] == '"' and content[index-1] == '\\' and content[index-2] != '\\')));
            return index;
        }